

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O3

void __thiscall
QSortFilterProxyModel::setRecursiveFilteringEnabled(QSortFilterProxyModel *this,bool recursive)

{
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
  *this_00;
  QSortFilterProxyModelPrivate *this_01;
  parameter_type pVar1;
  long in_FS_OFFSET;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QSortFilterProxyModelPrivate **)(this + 8);
  this_00 = &this_01->filter_recursive;
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper(this_00);
  pVar1 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
          ::value(this_00);
  if (pVar1 != recursive) {
    local_48.r = -1;
    local_48.c = -1;
    local_48.i = 0;
    local_48.m.ptr = (QAbstractItemModel *)0x0;
    QSortFilterProxyModelPrivate::filter_about_to_be_changed(this_01,&local_48);
    (this_01->filter_recursive).super_QPropertyData<bool>.val = recursive;
    local_48.r = -1;
    local_48.c = -1;
    local_48.i = 0;
    local_48.m.ptr = (QAbstractItemModel *)0x0;
    QSortFilterProxyModelPrivate::filter_changed(this_01,(Directions)0x1,&local_48);
    QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
    ::notify(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModel::setRecursiveFilteringEnabled(bool recursive)
{
    Q_D(QSortFilterProxyModel);
    d->filter_recursive.removeBindingUnlessInWrapper();
    if (d->filter_recursive == recursive)
        return;
    d->filter_about_to_be_changed();
    d->filter_recursive.setValueBypassingBindings(recursive);
    d->filter_changed(Direction::Rows);
    d->filter_recursive.notify(); // also emits a signal
}